

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# w3interp.cpp
# Opt level: O2

void __thiscall w3Interp::CountSetBits_i64(w3Interp *this)

{
  uint64_t *puVar1;
  uint32_t n;
  uint uVar2;
  uint64_t uVar3;
  
  puVar1 = w3Stack::u64(&this->super_w3Stack);
  uVar2 = 0;
  for (uVar3 = *puVar1; uVar3 != 0; uVar3 = uVar3 >> 1) {
    uVar2 = uVar2 + ((uint)uVar3 & 1);
  }
  *puVar1 = (ulong)uVar2;
  return;
}

Assistant:

INTERP (CountSetBits_i64)
{
    uint64_t& a = u64 ();
#if _MSC_VER && _M_AMD64
    a = __popcnt64 (a);
#else
    a = count_set_bits (a);
#endif
}